

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void dumpBool1(uint8_t value,bool inArray)

{
  char *pcVar1;
  int iVar2;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  char *__format;
  
  pcVar1 = "";
  if ((int)CONCAT71(in_register_00000031,inArray) != 0) {
    pcVar1 = " ";
  }
  iVar2 = (int)CONCAT71(in_register_00000039,value);
  printf("%02hhx                      %s",CONCAT71(in_register_00000039,value) & 0xffffffff,pcVar1);
  pcVar1 = "(invalid) TRUE";
  if (iVar2 == 1) {
    pcVar1 = "TRUE";
  }
  __format = "FALSE";
  if (iVar2 != 0) {
    __format = pcVar1;
  }
  printf(__format);
  return;
}

Assistant:

void dumpBool1(uint8_t value, bool inArray = false)
{
	printf("%02hhx                      %s", value, inArray ? " " : "");
	switch (value)
	{
	case 0:
		printf("FALSE");
		break;
	case 1:
		printf("TRUE");
		break;
	default:
		printf("(invalid) TRUE");
		break;
	}
}